

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O2

QString * encodeByteArray(QString *__return_storage_ptr__,QCborContainerPrivate *d,qsizetype idx,
                         QCborTag encoding)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  ByteData *pBVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pBVar4 = QCborContainerPrivate::byteData(d,idx);
  if (pBVar4 == (ByteData *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_002c1db1;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::fromRawData((QByteArray *)&local_38,(char *)(pBVar4 + 1),pBVar4->len);
    if (encoding == 0x16) {
      QByteArray::toBase64((QByteArray *)&local_58,(QByteArray *)&local_38,(Base64Options)0x0);
    }
    else if (encoding == 0x17) {
      QByteArray::toHex((QByteArray *)&local_58,(QByteArray *)&local_38,'\0');
    }
    else {
      QByteArray::toBase64((QByteArray *)&local_58,(QByteArray *)&local_38,(Base64Options)0x3);
    }
    qVar3 = local_38.size;
    pcVar2 = local_38.ptr;
    pDVar1 = local_38.d;
    local_38.d = local_58.d;
    local_38.ptr = local_58.ptr;
    local_58.d = pDVar1;
    local_58.ptr = pcVar2;
    local_38.size = local_58.size;
    local_58.size = qVar3;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    QString::fromLatin1<void>(__return_storage_ptr__,(QByteArray *)&local_38);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_002c1db1:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static QString encodeByteArray(const QCborContainerPrivate *d, qsizetype idx, QCborTag encoding)
{
    const ByteData *b = d->byteData(idx);
    if (!b)
        return QString();

    QByteArray data = QByteArray::fromRawData(b->byte(), b->len);
    if (encoding == QCborKnownTags::ExpectedBase16)
        data = data.toHex();
    else if (encoding == QCborKnownTags::ExpectedBase64)
        data = data.toBase64();
    else
        data = data.toBase64(QByteArray::Base64UrlEncoding | QByteArray::OmitTrailingEquals);

    return QString::fromLatin1(data);
}